

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::scanStruct(Parser *this,ScannedTopLevelItem *item)

{
  Module *pMVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string_view name_00;
  string name;
  string local_a0;
  string local_80;
  _Alloc_hider local_60;
  
  readQualifiedGeneralIdentifier_abi_cxx11_(&local_a0,this);
  pMVar1 = pool_ptr<soul::Module>::operator->(&this->module);
  name_00._M_str = (char *)local_a0._M_string_length;
  name_00._M_len = (size_t)&pMVar1->structs;
  Module::Structs::find((Structs *)&stack0xffffffffffffffa0,name_00);
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)&stack0xffffffffffffffa0);
  if ((RefCountedPtr<soul::Structure> *)local_60._M_p != (RefCountedPtr<soul::Structure> *)0x0) {
    Errors::nameInUse<std::__cxx11::string&>
              ((CompileMessage *)&stack0xffffffffffffffa0,(Errors *)&local_a0,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&stack0xffffffffffffffa0);
    CompileMessage::~CompileMessage((CompileMessage *)&stack0xffffffffffffffa0);
  }
  pMVar1 = pool_ptr<soul::Module>::operator->(&this->module);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
    local_80.field_2._8_8_ = local_a0.field_2._8_8_;
  }
  else {
    local_80._M_dataplus._M_p = local_a0._M_dataplus._M_p;
  }
  local_80._M_string_length = local_a0._M_string_length;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  Module::Structs::add(&pMVar1->structs,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x275da0);
  local_60._M_p =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::emplace_back<soul::UTF8Reader>
            (&item->structBodyCode,(UTF8Reader *)&stack0xffffffffffffffa0);
  skipPastNextOccurrenceOf(this,(TokenType)0x2748be);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void scanStruct (ScannedTopLevelItem& item)
    {
        auto name = readQualifiedGeneralIdentifier();

        if (module->structs.find (name) != nullptr)
            throwError (Errors::nameInUse (name));

        module->structs.add (std::move (name));
        expect (HEARTOperator::openBrace);
        item.structBodyCode.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::closeBrace);
    }